

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_>::freeData
          (Span<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *this)

{
  Entry *pEVar1;
  int *piVar2;
  long lVar3;
  
  if (this->entries != (Entry *)0x0) {
    lVar3 = 0;
    do {
      if ((ulong)this->offsets[lVar3] != 0xff) {
        pEVar1 = this->entries + this->offsets[lVar3];
        piVar2 = *(int **)((pEVar1->storage).data + 0x30);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate(*(QArrayData **)((pEVar1->storage).data + 0x30),2,0x10);
          }
        }
        piVar2 = *(int **)((pEVar1->storage).data + 0x18);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate(*(QArrayData **)((pEVar1->storage).data + 0x18),2,0x10);
          }
        }
        piVar2 = *(int **)(pEVar1->storage).data;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            QArrayData::deallocate(*(QArrayData **)(pEVar1->storage).data,2,0x10);
          }
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x80);
    if (this->entries != (Entry *)0x0) {
      operator_delete__(this->entries);
    }
    this->entries = (Entry *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }